

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O0

bool __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::exists
          (KDTree<phosg::Vector2<long>,_long> *this,Vector2<long> *low,Vector2<long> *high)

{
  value_type this_00;
  bool bVar1;
  reference ppNVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool high_greater;
  bool low_less;
  ulong uStack_98;
  size_t dim;
  Node *n;
  undefined1 local_78 [8];
  deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  level_nodes;
  Vector2<long> *high_local;
  Vector2<long> *low_local;
  KDTree<phosg::Vector2<long>,_long> *this_local;
  
  if (this->root == (Node *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    level_nodes.
    super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)high;
    ::std::
    deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ::deque((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
             *)local_78);
    ::std::
    deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
    ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*const&>
              ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                *)local_78,&this->root);
    while (bVar1 = ::std::
                   deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                   ::empty((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                            *)local_78), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppNVar2 = ::std::
                deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                ::front((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                         *)local_78);
      this_00 = *ppNVar2;
      ::std::
      deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
      ::pop_front((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                   *)local_78);
      for (uStack_98 = 0; sVar3 = Vector2<long>::dimensions(), uStack_98 < sVar3;
          uStack_98 = uStack_98 + 1) {
        lVar4 = Vector2<long>::at(&this_00->pt,uStack_98);
        lVar5 = Vector2<long>::at(low,uStack_98);
        if (lVar4 < lVar5) break;
        lVar4 = Vector2<long>::at(&this_00->pt,uStack_98);
        lVar5 = Vector2<long>::at((Vector2<long> *)
                                  level_nodes.
                                  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_node,uStack_98);
        if (lVar5 <= lVar4) break;
      }
      sVar3 = Vector2<long>::dimensions();
      if (uStack_98 == sVar3) {
        this_local._7_1_ = true;
        goto LAB_0010d39a;
      }
      lVar4 = Vector2<long>::at(low,this_00->dim);
      lVar5 = Vector2<long>::at(&this_00->pt,this_00->dim);
      lVar6 = Vector2<long>::at((Vector2<long> *)
                                level_nodes.
                                super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node,this_00->dim);
      lVar7 = Vector2<long>::at(&this_00->pt,this_00->dim);
      if ((lVar4 < lVar5) && (this_00->before != (Node *)0x0)) {
        ::std::
        deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
        ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
                  ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                    *)local_78,&this_00->before);
      }
      if ((lVar7 <= lVar6) && (this_00->after_or_equal != (Node *)0x0)) {
        ::std::
        deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
        ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
                  ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                    *)local_78,&this_00->after_or_equal);
      }
    }
    this_local._7_1_ = false;
LAB_0010d39a:
    ::std::
    deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ::~deque((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
              *)local_78);
  }
  return this_local._7_1_;
}

Assistant:

bool KDTree<CoordType, ValueType>::exists(const CoordType& low,
    const CoordType& high) const {
  if (this->root == nullptr) {
    return false;
  }

  std::deque<Node*> level_nodes;
  level_nodes.emplace_back(this->root);
  while (!level_nodes.empty()) {
    Node* n = level_nodes.front();
    level_nodes.pop_front();

    // if this node is within the range, return it
    {
      size_t dim;
      for (dim = 0; dim < CoordType::dimensions(); dim++) {
        if ((n->pt.at(dim) < low.at(dim)) ||
            (n->pt.at(dim) >= high.at(dim))) {
          break;
        }
      }
      if (dim == CoordType::dimensions()) {
        return true;
      }
    }

    // if the range falls entirely on one side of the node, move down to that
    // node. otherwise, move down to both nodes
    bool low_less = (low.at(n->dim) < n->pt.at(n->dim));
    bool high_greater = (high.at(n->dim) >= n->pt.at(n->dim));
    if (low_less && n->before) {
      level_nodes.emplace_back(n->before);
    }
    if (high_greater && n->after_or_equal) {
      level_nodes.emplace_back(n->after_or_equal);
    }
  }
  return false;
}